

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeColSingletonPS::FreeColSingletonPS
          (FreeColSingletonPS *this,SPxLPBase<double> *lp,SPxMainSM<double> *simplifier,int _j,
          int _i,double slackVal,shared_ptr<soplex::Tolerances> *tols)

{
  bool bVar1;
  int iVar2;
  SPxSense SVar3;
  undefined4 in_ECX;
  long *in_RDX;
  SPxLPBase<double> *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  long in_XMM0_Qa;
  double dVar4;
  double dVar5;
  SVectorBase<double> *in_stack_fffffffffffffee8;
  SPxLPBase<double> *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int i;
  SVectorBase<double> *this_00;
  SPxLPBase<double> *in_stack_ffffffffffffff00;
  SPxLPBase<double> *this_01;
  char *in_stack_ffffffffffffff08;
  PostStep *in_stack_ffffffffffffff10;
  double local_98;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffef0,
             (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffee8);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x28b07c);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x28b092);
  PostStep::PostStep(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff00,
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8)
  ;
  i = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x28b0db);
  *in_RDI = (long)&PTR__FreeColSingletonPS_00897b20;
  *(undefined4 *)(in_RDI + 5) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_R8D;
  iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x28b11a);
  *(int *)(in_RDI + 6) = iVar2 + -1;
  iVar2 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x28b157);
  *(int *)((long)in_RDI + 0x34) = iVar2 + -1;
  SVar3 = SPxLPBase<double>::spxSense(in_RSI);
  if (SVar3 == MINIMIZE) {
    local_98 = SPxLPBase<double>::obj(in_stack_ffffffffffffff00,i);
  }
  else {
    local_98 = SPxLPBase<double>::obj(in_stack_ffffffffffffff00,i);
    local_98 = -local_98;
  }
  in_RDI[7] = (long)local_98;
  in_RDI[8] = in_XMM0_Qa;
  SPxLPBase<double>::lhs(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  (**(code **)(*in_RDI + 0x38))();
  bVar1 = EQ<double,double,double>
                    ((double)in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8,
                     1.3177452110429e-317);
  *(bool *)(in_RDI + 9) = bVar1;
  SPxLPBase<double>::lhs(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  SPxLPBase<double>::rhs(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  (**(code **)(*in_RDI + 0x38))();
  bVar1 = EQ<double,double,double>
                    ((double)in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8,
                     1.31782327341494e-317);
  *(bool *)((long)in_RDI + 0x49) = bVar1;
  this_01 = (SPxLPBase<double> *)(in_RDI + 10);
  SPxLPBase<double>::rowVector
            (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  DSVectorBase<double>::DSVectorBase<double>
            ((DSVectorBase<double> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  this_00 = (SVectorBase<double> *)in_RDI[8];
  dVar4 = SPxLPBase<double>::obj(this_01,(int)((ulong)this_00 >> 0x20));
  dVar5 = SVectorBase<double>::operator[](this_00,(int)((ulong)in_RDX >> 0x20));
  (**(code **)(*in_RDX + 0x88))((double)this_00 * (dVar4 / dVar5));
  return;
}

Assistant:

FreeColSingletonPS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, int _i,
                         R slackVal, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeColSingleton", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lRhs(slackVal)
         , m_onLhs(EQ(slackVal, lp.lhs(_i), this->epsilon()))
         , m_eqCons(EQ(lp.lhs(_i), lp.rhs(_i), this->epsilon()))
         , m_row(lp.rowVector(_i))
      {
         assert(m_row[m_j] != 0.0);
         simplifier.addObjoffset(m_lRhs * (lp.obj(m_j) / m_row[m_j]));
      }